

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AC3DImporter::InternReadFile
          (AC3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte bVar3;
  pointer paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  pointer pMVar7;
  IOStream *pIVar8;
  aiScene *paVar9;
  pointer __src;
  pointer __src_00;
  pointer pcVar10;
  int iVar11;
  undefined4 extraout_var;
  Logger *pLVar12;
  size_t sVar13;
  byte *pbVar14;
  pointer this_00;
  aiNode *paVar15;
  aiMesh **__dest;
  aiMaterial **__dest_00;
  aiLight **__dest_01;
  long *plVar16;
  runtime_error *prVar17;
  ai_real *paVar18;
  byte *pbVar19;
  pointer __src_01;
  uint i_1;
  byte *pbVar20;
  uint uVar21;
  char *pcVar22;
  int iVar23;
  char *pcVar24;
  ulong __n;
  uint i;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  char msg [3];
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> materials;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> rootObjects;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> omaterials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<aiLight_*,_std::allocator<aiLight_*>_> lights;
  vector<char,_std::allocator<char>_> mBuffer2;
  char local_28b;
  char local_28a [2];
  undefined1 local_288 [40];
  pointer local_260;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> local_258;
  IOStream *local_238;
  aiScene *local_230;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_228;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_208;
  vector<aiLight_*,_std::allocator<aiLight_*>_> local_1e8;
  vector<char,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  ai_real local_1a0;
  ai_real aStack_19c;
  ai_real aStack_198;
  ai_real aStack_194;
  ai_real aStack_190;
  ai_real local_18c;
  ai_real aStack_188;
  undefined1 local_184 [16];
  float local_174;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  ios_base local_138 [264];
  
  local_230 = pScene;
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8);
  local_238 = (IOStream *)CONCAT44(extraout_var,iVar11);
  if (local_1a8 != (undefined1  [8])&aStack_198) {
    operator_delete((void *)local_1a8,CONCAT44(aStack_194,aStack_198) + 1);
  }
  if (local_238 == (IOStream *)0x0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   "Failed to open AC3D file ",pFile);
    plVar16 = (long *)std::__cxx11::string::append(local_288);
    local_1a8 = (undefined1  [8])*plVar16;
    paVar18 = (ai_real *)(plVar16 + 2);
    if (local_1a8 == (undefined1  [8])paVar18) {
      aStack_198 = (ai_real)*(long *)paVar18;
      aStack_194 = (ai_real)((ulong)*(long *)paVar18 >> 0x20);
      aStack_190 = (ai_real)plVar16[3];
      local_18c = (ai_real)((ulong)plVar16[3] >> 0x20);
      local_1a8 = (undefined1  [8])&aStack_198;
    }
    else {
      aStack_198 = (ai_real)*(long *)paVar18;
      aStack_194 = (ai_real)((ulong)*(long *)paVar18 >> 0x20);
    }
    local_1a0 = (ai_real)plVar16[1];
    aStack_19c = (ai_real)((ulong)plVar16[1] >> 0x20);
    *plVar16 = (long)paVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(local_238,&local_1c8,FORBID_EMPTY);
  pcVar10 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  this->buffer = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  this->mNumMeshes = 0;
  this->lights = 0;
  this->groups = 0;
  this->polys = 0;
  this->worlds = 0;
  iVar11 = strncmp(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,"AC3D",4);
  if (iVar11 != 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])&aStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"AC3D: No valid AC3D file, magic sequence not found","");
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar2 = pcVar10[4];
  iVar11 = (int)cVar2;
  if ((byte)(cVar2 - 0x30U) < 10) {
    iVar11 = iVar11 + -0x30;
LAB_003877f6:
    if (-1 < iVar11) {
      uVar21 = 1;
      pcVar22 = &local_28b;
      goto LAB_0038781b;
    }
  }
  else {
    if ((byte)(cVar2 + 0x9fU) < 6) {
      iVar11 = iVar11 + -0x57;
      goto LAB_003877f6;
    }
    if ((byte)(cVar2 + 0xbfU) < 6) {
      iVar11 = iVar11 + -0x37;
      goto LAB_003877f6;
    }
    iVar11 = -1;
  }
  pcVar22 = local_28a;
  local_28b = '-';
  iVar11 = -iVar11;
  uVar21 = 2;
LAB_0038781b:
  iVar23 = 1000000000;
  bVar3 = 0;
  do {
    bVar27 = (int)((long)iVar11 / (long)iVar23) != 0;
    bVar28 = iVar23 == 1;
    if ((bool)(bVar3 | bVar28 | bVar27)) {
      pcVar24 = pcVar22 + 1;
      *pcVar22 = (char)((long)iVar11 / (long)iVar23) + '0';
      pcVar22 = pcVar24;
      if (iVar23 == 1) break;
      uVar21 = uVar21 + 1;
      iVar11 = iVar11 % iVar23;
    }
    iVar23 = iVar23 / 10;
    bVar3 = bVar3 | bVar28 | bVar27;
  } while (uVar21 < 3);
  *pcVar22 = '\0';
  pLVar12 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"AC3D file format version: ");
  sVar13 = strlen(&local_28b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_28b,sVar13);
  std::__cxx11::stringbuf::str();
  Logger::info(pLVar12,(char *)local_288._0_8_);
  if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (pointer)0x0;
  local_288._16_8_ = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )local_288,5);
  local_258.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (Object *)0x0;
  local_258.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Object *)0x0;
  local_258.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::reserve
            (&local_258,5);
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mLights = &local_1e8;
  bVar27 = GetNextLine(this);
  if (bVar27) {
    do {
      pcVar22 = this->buffer;
      iVar11 = strncmp("MATERIAL",pcVar22,8);
      if (iVar11 == 0) {
        bVar3 = pcVar22[8];
        if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
        goto LAB_003879b1;
        pcVar24 = pcVar22 + 9;
        if (bVar3 == 0) {
          pcVar24 = pcVar22 + 8;
        }
        this->buffer = pcVar24;
        local_1a8 = (undefined1  [8])0x3f19999a3f19999a;
        local_1a0 = 0.6;
        local_18c = 0.0;
        aStack_188 = 0.0;
        aStack_19c = 0.0;
        aStack_198 = 0.0;
        aStack_194 = 0.0;
        aStack_190 = 0.0;
        local_184._0_4_ = 1.0;
        local_184._4_4_ = 1.0;
        local_184._8_8_ = 0x3f800000;
        local_174 = 0.0;
        local_168 = 0;
        local_160[0]._M_local_buf[0] = '\0';
        local_170._M_p = (pointer)local_160;
        std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ::emplace_back<Assimp::AC3DImporter::Material>
                  ((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                    *)local_288,(Material *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != local_160) {
          operator_delete(local_170._M_p,
                          CONCAT71(local_160[0]._M_allocated_capacity._1_7_,
                                   local_160[0]._M_local_buf[0]) + 1);
        }
        uVar6 = local_288._8_8_;
        uVar21 = ~(uint)this->buffer;
        pbVar14 = (byte *)this->buffer;
        while( true ) {
          pbVar20 = pbVar14 + 1;
          if ((*pbVar14 != 0x20) && (*pbVar14 != 9)) break;
          uVar21 = uVar21 - 1;
          pbVar14 = pbVar20;
        }
        this->buffer = (char *)pbVar14;
        uVar26 = (ulong)*pbVar14;
        if (uVar26 < 0x23) {
          if ((0x3401UL >> (uVar26 & 0x3f) & 1) != 0) goto LAB_00387abe;
          pbVar19 = pbVar20;
          if (uVar26 != 0x22) goto LAB_00387c19;
LAB_00387afc:
          this->buffer = (char *)pbVar19;
          uVar26 = (ulong)*pbVar19;
          if (0x22 < uVar26) {
LAB_00387b1a:
            pbVar19 = pbVar19 + 1;
            goto LAB_00387afc;
          }
          if ((0x3401UL >> (uVar26 & 0x3f) & 1) == 0) {
            if (uVar26 == 0x22) goto LAB_00387b69;
            goto LAB_00387b1a;
          }
          pLVar12 = DefaultLogger::get();
          Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL in string");
          std::__cxx11::string::_M_replace
                    ((ulong)&((pointer)(uVar6 + -0x58))->name,0,
                     (char *)(((pointer)(uVar6 + -0x58))->name)._M_string_length,0x69ad6e);
          pbVar19 = (byte *)this->buffer;
          if ((*pbVar19 < 0xe) && ((0x3401U >> (*pbVar19 & 0x1f) & 1) != 0)) goto LAB_00387ad2;
LAB_00387b69:
          local_1a8 = (undefined1  [8])&aStack_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pbVar20,pbVar20 + ((int)pbVar19 + uVar21));
          std::__cxx11::string::operator=
                    ((string *)&((pointer)(uVar6 + -0x58))->name,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])&aStack_198) {
            operator_delete((void *)local_1a8,CONCAT44(aStack_194,aStack_198) + 1);
          }
          pbVar14 = (byte *)(this->buffer + 1);
          this->buffer = (char *)pbVar14;
          for (; (*pbVar14 == 0x20 || (*pbVar14 == 9)); pbVar14 = pbVar14 + 1) {
          }
          this->buffer = (char *)pbVar14;
          bVar3 = *pbVar14;
          uVar26 = (ulong)bVar3;
          if ((0xd < bVar3) || ((0x3401U >> (bVar3 & 0x1f) & 1) == 0)) goto LAB_00387c19;
          pLVar12 = DefaultLogger::get();
          Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
        }
        else {
LAB_00387c19:
          while (((char)uVar26 == ' ' || ((int)uVar26 == 9))) {
            pbVar20 = pbVar14 + 1;
            pbVar14 = pbVar14 + 1;
            uVar26 = (ulong)*pbVar20;
          }
          this->buffer = (char *)pbVar14;
          bVar3 = *pbVar14;
          if ((bVar3 < 0xe) && ((0x3401U >> (bVar3 & 0x1f) & 1) != 0)) {
LAB_00387abe:
            pLVar12 = DefaultLogger::get();
            pcVar22 = "AC3D: Unexpected EOF/EOL";
          }
          else if (((bVar3 == 0x72) && ((pbVar14[1] == 0x67 && (pbVar14[2] == 0x62)))) &&
                  ((pbVar14[3] == 9 || (pbVar14[3] == 0x20)))) {
            this->buffer = (char *)(pbVar14 + 4);
            lVar25 = 0;
            do {
              for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                  pbVar14 = pbVar14 + 1) {
              }
              this->buffer = (char *)pbVar14;
              if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                pLVar12 = DefaultLogger::get();
                Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
              }
              else {
                pcVar22 = fast_atoreal_move<float>
                                    ((char *)pbVar14,&(((pointer)(uVar6 + -0x58))->rgb).r + lVar25,
                                     true);
                this->buffer = pcVar22;
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 != 3);
            for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                pbVar14 = pbVar14 + 1) {
            }
            this->buffer = (char *)pbVar14;
            bVar3 = *pbVar14;
            if ((bVar3 < 0xe) && ((0x3401U >> (bVar3 & 0x1f) & 1) != 0)) goto LAB_00387abe;
            if (((bVar3 == 0x61) && ((pbVar14[1] == 0x6d && (pbVar14[2] == 0x62)))) &&
               ((pbVar14[3] == 9 || (pbVar14[3] == 0x20)))) {
              this->buffer = (char *)(pbVar14 + 4);
              lVar25 = 0;
              do {
                for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                    pbVar14 = pbVar14 + 1) {
                }
                this->buffer = (char *)pbVar14;
                if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                  pLVar12 = DefaultLogger::get();
                  Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
                }
                else {
                  pcVar22 = fast_atoreal_move<float>
                                      ((char *)pbVar14,(float *)(uVar6 + lVar25 * 4 + -0x4c),true);
                  this->buffer = pcVar22;
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 != 3);
              for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                  pbVar14 = pbVar14 + 1) {
              }
              this->buffer = (char *)pbVar14;
              if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) goto LAB_00387abe;
              iVar11 = strncmp((char *)pbVar14,"emis",4);
              if ((iVar11 == 0) && ((pbVar14[4] == 9 || (pbVar14[4] == 0x20)))) {
                this->buffer = (char *)(pbVar14 + 5);
                local_260 = (pointer)uVar6;
                lVar25 = 0;
                do {
                  for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                      pbVar14 = pbVar14 + 1) {
                  }
                  this->buffer = (char *)pbVar14;
                  if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                    pLVar12 = DefaultLogger::get();
                    Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
                  }
                  else {
                    pcVar22 = fast_atoreal_move<float>
                                        ((char *)pbVar14,(float *)(uVar6 + lVar25 * 4 + -0x40),true)
                    ;
                    this->buffer = pcVar22;
                  }
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                    pbVar14 = pbVar14 + 1) {
                }
                this->buffer = (char *)pbVar14;
                if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0))
                goto LAB_00387abe;
                iVar11 = strncmp((char *)pbVar14,"spec",4);
                pMVar7 = local_260;
                if ((iVar11 == 0) && ((pbVar14[4] == 9 || (pbVar14[4] == 0x20)))) {
                  this->buffer = (char *)(pbVar14 + 5);
                  lVar25 = 0;
                  do {
                    for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                        pbVar14 = pbVar14 + 1) {
                    }
                    this->buffer = (char *)pbVar14;
                    if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                      pLVar12 = DefaultLogger::get();
                      Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
                    }
                    else {
                      pcVar22 = fast_atoreal_move<float>
                                          ((char *)pbVar14,
                                           (float *)((long)pMVar7 + lVar25 * 4 + -0x34),true);
                      this->buffer = pcVar22;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  for (pbVar14 = (byte *)this->buffer; (*pbVar14 == 0x20 || (*pbVar14 == 9));
                      pbVar14 = pbVar14 + 1) {
                  }
                  this->buffer = (char *)pbVar14;
                  bVar3 = *pbVar14;
                  if ((bVar3 < 0xe) && ((0x3401U >> (bVar3 & 0x1f) & 1) != 0)) goto LAB_00387abe;
                  if (((bVar3 == 0x73) && ((pbVar14[1] == 0x68 && (pbVar14[2] == 0x69)))) &&
                     ((pbVar14[3] == 9 || (pbVar14[3] == 0x20)))) {
                    pbVar14 = pbVar14 + 4;
                    this->buffer = (char *)pbVar14;
                    for (; (*pbVar14 == 0x20 || (*pbVar14 == 9)); pbVar14 = pbVar14 + 1) {
                    }
                    this->buffer = (char *)pbVar14;
                    if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                      pLVar12 = DefaultLogger::get();
                      Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
                      pbVar14 = (byte *)this->buffer;
                    }
                    else {
                      pbVar14 = (byte *)fast_atoreal_move<float>
                                                  ((char *)pbVar14,&local_260[-1].shin,true);
                      this->buffer = (char *)pbVar14;
                    }
                    for (; (*pbVar14 == 0x20 || (*pbVar14 == 9)); pbVar14 = pbVar14 + 1) {
                    }
                    this->buffer = (char *)pbVar14;
                    if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0))
                    goto LAB_00387abe;
                    iVar11 = strncmp((char *)pbVar14,"trans",5);
                    if ((iVar11 == 0) && ((pbVar14[5] == 9 || (pbVar14[5] == 0x20)))) {
                      pbVar14 = pbVar14 + 6;
                      this->buffer = (char *)pbVar14;
                      for (; (*pbVar14 == 0x20 || (*pbVar14 == 9)); pbVar14 = pbVar14 + 1) {
                      }
                      this->buffer = (char *)pbVar14;
                      if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) {
                        pLVar12 = DefaultLogger::get();
                        Logger::error(pLVar12,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar22 = fast_atoreal_move<float>
                                            ((char *)pbVar14,&local_260[-1].trans,true);
                        this->buffer = pcVar22;
                      }
                      goto LAB_003879b1;
                    }
                    pLVar12 = DefaultLogger::get();
                    pcVar22 = "AC3D: Unexpexted token. trans was expected.";
                  }
                  else {
                    pLVar12 = DefaultLogger::get();
                    pcVar22 = "AC3D: Unexpexted token. shi was expected.";
                  }
                }
                else {
                  pLVar12 = DefaultLogger::get();
                  pcVar22 = "AC3D: Unexpexted token. spec was expected.";
                }
              }
              else {
                pLVar12 = DefaultLogger::get();
                pcVar22 = "AC3D: Unexpexted token. emis was expected.";
              }
            }
            else {
              pLVar12 = DefaultLogger::get();
              pcVar22 = "AC3D: Unexpexted token. amb was expected.";
            }
          }
          else {
            pLVar12 = DefaultLogger::get();
            pcVar22 = "AC3D: Unexpexted token. rgb was expected.";
          }
          Logger::error(pLVar12,pcVar22);
        }
      }
      else {
LAB_003879b1:
        LoadObjectSection(this,&local_258);
      }
LAB_00387ad2:
      bVar27 = GetNextLine(this);
    } while (bVar27);
  }
  if ((local_258.
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_258.
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (uVar21 = this->mNumMeshes, uVar21 == 0)) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])&aStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"AC3D: No meshes have been loaded","");
    std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
    *(undefined ***)prVar17 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_288._0_8_ == local_288._8_8_) {
    pLVar12 = DefaultLogger::get();
    Logger::warn(pLVar12,"AC3D: No material has been found");
    local_1a8 = (undefined1  [8])0x3f19999a3f19999a;
    local_1a0 = 0.6;
    aStack_19c = 0.0;
    aStack_198 = 0.0;
    aStack_194 = 0.0;
    aStack_190 = 0.0;
    local_18c = 0.0;
    aStack_188 = 0.0;
    local_184._0_4_ = 1.0;
    local_184._4_4_ = 1.0;
    local_184._8_8_ = 0x3f800000;
    local_174 = 0.0;
    local_168 = 0;
    local_160[0]._M_local_buf[0] = '\0';
    local_170._M_p = (pointer)local_160;
    std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
    emplace_back<Assimp::AC3DImporter::Material>
              ((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                *)local_288,(Material *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != local_160) {
      operator_delete(local_170._M_p,
                      CONCAT71(local_160[0]._M_allocated_capacity._1_7_,local_160[0]._M_local_buf[0]
                              ) + 1);
    }
    uVar21 = this->mNumMeshes;
  }
  uVar21 = uVar21 + (uVar21 >> 2) + 1;
  this->mNumMeshes = uVar21;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_208,(ulong)uVar21);
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )local_288,(ulong)this->mNumMeshes);
  this_00 = local_258.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_258.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_258.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
    this_00 = (pointer)operator_new(0xe0);
    Object::Object(this_00);
  }
  paVar15 = ConvertObjectSection
                      (this,this_00,&local_208,&local_228,
                       (vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                        *)local_288,(aiNode *)0x0);
  paVar9 = local_230;
  local_230->mRootNode = paVar15;
  if ((long)local_258.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_258.
            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
    std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
    ~vector(&this_00->surfaces);
    paVar4 = (this_00->vertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (paVar4 != (pointer)0x0) {
      operator_delete(paVar4,(long)(this_00->vertices).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar4
                     );
    }
    pcVar5 = (this_00->texture)._M_dataplus._M_p;
    paVar1 = &(this_00->texture).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
    ~vector(&this_00->children);
    pcVar5 = (this_00->name)._M_dataplus._M_p;
    paVar1 = &(this_00->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(this_00,0xe0);
    paVar15 = paVar9->mRootNode;
  }
  pcVar22 = (paVar15->mName).data;
  iVar11 = strncmp(pcVar22,"Node",4);
  __src_01 = local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (iVar11 == 0) {
    (paVar15->mName).length = 0xb;
    builtin_strncpy(pcVar22,"<AC3DWorld>",0xc);
  }
  if (local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar9->mNumMeshes =
         (uint)((ulong)((long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    uVar26 = (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start & 0x7fffffff8;
    __dest = (aiMesh **)operator_new__(uVar26);
    paVar9->mMeshes = __dest;
    memcpy(__dest,__src_01,uVar26);
    __src = local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    paVar9->mNumMaterials =
         (uint)((ulong)((long)local_228.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_228.
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
    uVar26 = (long)local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_228.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                   .super__Vector_impl_data._M_start & 0x7fffffff8;
    __dest_00 = (aiMaterial **)operator_new__(uVar26);
    paVar9->mMaterials = __dest_00;
    memcpy(__dest_00,__src,uVar26);
    __src_00 = local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar26 = (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    paVar9->mNumLights = (uint)uVar26;
    __n = (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (__n != 0) {
      __dest_01 = (aiLight **)operator_new__(-(ulong)(uVar26 >> 0x3d != 0) | __n);
      local_230->mLights = __dest_01;
      memcpy(__dest_01,__src_00,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)local_228.
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
      __src_01 = local_208.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    pIVar8 = local_238;
    if (__src_01 != (pointer)0x0) {
      operator_delete(__src_01,(long)local_208.
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)__src_01);
    }
    if (local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
    ~vector(&local_258);
    std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
    ~vector((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
             *)local_288);
    if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    (*pIVar8->_vptr_IOStream[1])(pIVar8);
    return;
  }
  prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1a8 = (undefined1  [8])&aStack_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"An unknown error occurred during converting","");
  std::runtime_error::runtime_error(prVar17,(string *)local_1a8);
  *(undefined ***)prVar17 = &PTR__runtime_error_007dd738;
  __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AC3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open AC3D file " + pFile + ".");

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    buffer = &mBuffer2[0];
    mNumMeshes = 0;

    lights = polys = worlds = groups = 0;

    if (::strncmp(buffer,"AC3D",4)) {
        throw DeadlyImportError("AC3D: No valid AC3D file, magic sequence not found");
    }

    // print the file format version to the console
    unsigned int version = HexDigitToDecimal( buffer[4] );
    char msg[3];
    ASSIMP_itoa10(msg,3,version);
    ASSIMP_LOG_INFO_F("AC3D file format version: ", msg);

    std::vector<Material> materials;
    materials.reserve(5);

    std::vector<Object> rootObjects;
    rootObjects.reserve(5);

    std::vector<aiLight*> lights;
    mLights = & lights;

    while (GetNextLine())
    {
        if (TokenMatch(buffer,"MATERIAL",8))
        {
            materials.push_back(Material());
            Material& mat = materials.back();

            // manually parse the material ... sscanf would use the buldin atof ...
            // Format: (name) rgb %f %f %f  amb %f %f %f  emis %f %f %f  spec %f %f %f  shi %d  trans %f

            AI_AC_SKIP_TO_NEXT_TOKEN();
            if ('\"' == *buffer)
            {
                AI_AC_GET_STRING(mat.name);
                AI_AC_SKIP_TO_NEXT_TOKEN();
            }

            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("rgb",3,3,&mat.rgb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("amb",3,3,&mat.amb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("emis",4,3,&mat.emis);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("spec",4,3,&mat.spec);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("shi",3,1,&mat.shin);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("trans",5,1,&mat.trans);
        }
        LoadObjectSection(rootObjects);
    }

    if (rootObjects.empty() || !mNumMeshes)
    {
        throw DeadlyImportError("AC3D: No meshes have been loaded");
    }
    if (materials.empty())
    {
        ASSIMP_LOG_WARN("AC3D: No material has been found");
        materials.push_back(Material());
    }

    mNumMeshes += (mNumMeshes>>2u) + 1;
    std::vector<aiMesh*> meshes;
    meshes.reserve(mNumMeshes);

    std::vector<aiMaterial*> omaterials;
    materials.reserve(mNumMeshes);

    // generate a dummy root if there are multiple objects on the top layer
    Object* root;
    if (1 == rootObjects.size())
        root = &rootObjects[0];
    else
    {
        root = new Object();
    }

    // now convert the imported stuff to our output data structure
    pScene->mRootNode = ConvertObjectSection(*root,meshes,omaterials,materials);
    if (1 != rootObjects.size())delete root;

    if (!::strncmp( pScene->mRootNode->mName.data, "Node", 4))
        pScene->mRootNode->mName.Set("<AC3DWorld>");

    // copy meshes
    if (meshes.empty())
    {
        throw DeadlyImportError("An unknown error occurred during converting");
    }
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    ::memcpy(pScene->mMeshes,&meshes[0],pScene->mNumMeshes*sizeof(void*));

    // copy materials
    pScene->mNumMaterials = (unsigned int)omaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&omaterials[0],pScene->mNumMaterials*sizeof(void*));

    // copy lights
    pScene->mNumLights = (unsigned int)lights.size();
    if (lights.size())
    {
        pScene->mLights = new aiLight*[lights.size()];
        ::memcpy(pScene->mLights,&lights[0],lights.size()*sizeof(void*));
    }
}